

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall icu_63::UVector::removeAllElements(UVector *this)

{
  int local_14;
  int32_t i;
  UVector *this_local;
  
  if (this->deleter != (UObjectDeleter *)0x0) {
    for (local_14 = 0; local_14 < this->count; local_14 = local_14 + 1) {
      if (this->elements[local_14].pointer != (void *)0x0) {
        (*this->deleter)(this->elements[local_14].pointer);
      }
    }
  }
  this->count = 0;
  return;
}

Assistant:

void UVector::removeAllElements(void) {
    if (deleter != 0) {
        for (int32_t i=0; i<count; ++i) {
            if (elements[i].pointer != 0) {
                (*deleter)(elements[i].pointer);
            }
        }
    }
    count = 0;
}